

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O1

Transform * __thiscall sf::Transform::combine(Transform *this,Transform *transform)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float *a;
  
  fVar1 = this->m_matrix[4];
  fVar2 = transform->m_matrix[0];
  fVar3 = transform->m_matrix[1];
  fVar4 = this->m_matrix[0];
  fVar5 = this->m_matrix[1];
  fVar6 = this->m_matrix[0xc];
  fVar7 = transform->m_matrix[3];
  fVar8 = transform->m_matrix[4];
  fVar9 = transform->m_matrix[5];
  fVar10 = transform->m_matrix[7];
  fVar11 = transform->m_matrix[0xc];
  fVar12 = transform->m_matrix[0xd];
  fVar13 = transform->m_matrix[0xf];
  fVar14 = this->m_matrix[5];
  fVar15 = this->m_matrix[0xd];
  fVar16 = this->m_matrix[7];
  fVar17 = this->m_matrix[3];
  fVar18 = this->m_matrix[0xf];
  this->m_matrix[0] = fVar6 * fVar7 + fVar4 * fVar2 + fVar1 * fVar3;
  this->m_matrix[1] = fVar15 * fVar7 + fVar5 * fVar2 + fVar3 * fVar14;
  this->m_matrix[2] = 0.0;
  this->m_matrix[3] = fVar7 * fVar18 + fVar2 * fVar17 + fVar3 * fVar16;
  this->m_matrix[4] = fVar6 * fVar10 + fVar4 * fVar8 + fVar1 * fVar9;
  this->m_matrix[5] = fVar15 * fVar10 + fVar5 * fVar8 + fVar9 * fVar14;
  this->m_matrix[6] = 0.0;
  this->m_matrix[7] = fVar10 * fVar18 + fVar8 * fVar17 + fVar9 * fVar16;
  this->m_matrix[8] = 0.0;
  this->m_matrix[9] = 0.0;
  this->m_matrix[10] = 1.0;
  this->m_matrix[0xb] = 0.0;
  this->m_matrix[0xc] = fVar6 * fVar13 + fVar4 * fVar11 + fVar1 * fVar12;
  this->m_matrix[0xd] = fVar15 * fVar13 + fVar5 * fVar11 + fVar14 * fVar12;
  this->m_matrix[0xe] = 0.0;
  this->m_matrix[0xf] = fVar18 * fVar13 + fVar17 * fVar11 + fVar12 * fVar16;
  return this;
}

Assistant:

Transform& Transform::combine(const Transform& transform)
{
    const float* a = m_matrix;
    const float* b = transform.m_matrix;

    *this = Transform(a[0] * b[0]  + a[4] * b[1]  + a[12] * b[3],
                      a[0] * b[4]  + a[4] * b[5]  + a[12] * b[7],
                      a[0] * b[12] + a[4] * b[13] + a[12] * b[15],
                      a[1] * b[0]  + a[5] * b[1]  + a[13] * b[3],
                      a[1] * b[4]  + a[5] * b[5]  + a[13] * b[7],
                      a[1] * b[12] + a[5] * b[13] + a[13] * b[15],
                      a[3] * b[0]  + a[7] * b[1]  + a[15] * b[3],
                      a[3] * b[4]  + a[7] * b[5]  + a[15] * b[7],
                      a[3] * b[12] + a[7] * b[13] + a[15] * b[15]);

    return *this;
}